

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall
gulcalc::setmaxloss(gulcalc *this,
                   vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   *gilv)

{
  pointer pvVar1;
  pointer pgVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pgVar5;
  int iVar6;
  pointer pgVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  
  pvVar1 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(gilv->
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (3 < uVar3) {
    uVar4 = 3;
    do {
      pgVar5 = pvVar1[uVar4].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pgVar2 = *(pointer *)
                ((long)&pvVar1[uVar4].
                        super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (pgVar5 == pgVar2) {
        dVar10 = 0.0;
        dVar8 = 0.0;
      }
      else {
        iVar6 = 0;
        fVar9 = 0.0;
        pgVar7 = pgVar5;
        do {
          dVar10 = pgVar7->loss;
          if ((double)fVar9 < dVar10) {
            iVar6 = 0;
            fVar9 = (float)dVar10;
          }
          dVar8 = (double)fVar9;
          iVar6 = iVar6 + (uint)(dVar10 == dVar8);
          pgVar7 = pgVar7 + 1;
        } while (pgVar7 != pgVar2);
        dVar10 = (double)iVar6;
      }
      for (; pgVar5 != pgVar2; pgVar5 = pgVar5 + 1) {
        pgVar5->loss = (double)(-(ulong)(pgVar5->loss == dVar8) & (ulong)(pgVar5->loss / dVar10));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void gulcalc::setmaxloss(std::vector<std::vector<gulItemIDLoss>> &gilv) {

	for (size_t i = 3; i < gilv.size(); i++) {

		OASIS_FLOAT max_loss = 0.0;
		int max_loss_count = 0;

		// First loop: find maximum loss and count occurrences
		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss > max_loss) {
				max_loss = iter->loss;
				max_loss_count = 0;
			}
			if (iter->loss == max_loss) max_loss_count++;
			iter++;
		}

		// Second loop: distribute maximum losses evenly among highest
		// contributing subperils and set other losses to 0
		iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss == max_loss) iter->loss /= max_loss_count;
			else iter->loss = 0;
			iter++;
		}

	}

}